

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

bool __thiscall
nlohmann::detail::
parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
::sax_parse_internal
          (parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
           *this,json_sax_t *sax)

{
  undefined8 uVar1;
  _Bit_pointer puVar2;
  byte bVar3;
  bool bVar4;
  token_type tVar5;
  string_t *psVar6;
  number_integer_t nVar7;
  number_unsigned_t nVar8;
  size_t sVar9;
  size_t sVar10;
  token_type expected;
  reference rVar11;
  undefined1 local_458 [72];
  undefined1 local_410 [64];
  parse_error local_3d0;
  undefined1 local_3a8 [64];
  parse_error local_368;
  undefined1 local_340 [64];
  parse_error local_300;
  undefined1 local_2d8 [32];
  reference local_2b8;
  undefined1 local_2a8 [72];
  undefined1 local_260 [64];
  parse_error local_220;
  undefined1 local_1f8 [64];
  string local_1b8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198 [32];
  out_of_range local_178;
  undefined1 local_158 [40];
  number_float_t res;
  parse_error local_110;
  undefined1 local_e8 [64];
  parse_error local_a8;
  string local_80 [32];
  _Vector_impl local_60;
  undefined1 local_48 [7];
  bool skip_to_state_evaluation;
  vector<bool,_std::allocator<bool>_> states;
  json_sax_t *sax_local;
  parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  *this_local;
  
  states.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)sax;
  std::vector<bool,_std::allocator<bool>_>::vector((vector<bool,_std::allocator<bool>_> *)local_48);
  local_60._23_1_ = 0;
LAB_0015e78b:
  puVar2 = states.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_end_of_storage;
  expected = (token_type)this;
  if ((local_60._23_1_ & 1) != 0) {
    local_60._23_1_ = 0;
    goto LAB_0015f350;
  }
  switch(this->last_token) {
  case literal_true:
    bVar3 = (**(code **)(*states.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage + 8))();
    if (((bVar3 ^ 0xff) & 1) != 0) {
      this_local._7_1_ = false;
      goto LAB_0015fb2a;
    }
    break;
  case literal_false:
    bVar3 = (**(code **)(*states.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage + 8))
                      (states.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_end_of_storage,0);
    if (((bVar3 ^ 0xff) & 1) != 0) {
      this_local._7_1_ = false;
      goto LAB_0015fb2a;
    }
    break;
  case literal_null:
    bVar3 = (**(code **)*states.super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_end_of_storage)();
    if (((bVar3 ^ 0xff) & 1) != 0) {
      this_local._7_1_ = false;
      goto LAB_0015fb2a;
    }
    break;
  case value_string:
    psVar6 = lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
             ::get_string(&this->m_lexer);
    bVar3 = (**(code **)(*puVar2 + 0x28))(puVar2,psVar6);
    if (((bVar3 ^ 0xff) & 1) != 0) {
      this_local._7_1_ = false;
      goto LAB_0015fb2a;
    }
    break;
  case value_unsigned:
    nVar8 = lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
            ::get_number_unsigned(&this->m_lexer);
    bVar3 = (**(code **)(*puVar2 + 0x18))(puVar2,nVar8);
    if (((bVar3 ^ 0xff) & 1) != 0) {
      this_local._7_1_ = false;
      goto LAB_0015fb2a;
    }
    break;
  case value_integer:
    nVar7 = lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
            ::get_number_integer(&this->m_lexer);
    bVar3 = (**(code **)(*puVar2 + 0x10))(puVar2,nVar7);
    if (((bVar3 ^ 0xff) & 1) != 0) {
      this_local._7_1_ = false;
      goto LAB_0015fb2a;
    }
    break;
  case value_float:
    local_158._32_8_ =
         lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
         ::get_number_float(&this->m_lexer);
    bVar4 = std::isfinite((double)local_158._32_8_);
    puVar2 = states.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_end_of_storage;
    uVar1 = local_158._32_8_;
    if (((bVar4 ^ 0xffU) & 1) != 0) {
      sVar9 = lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
              ::get_position(&this->m_lexer);
      lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
      ::get_token_string((lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                          *)local_158);
      lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
      ::get_token_string((lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                          *)(local_1f8 + 0x20));
      std::operator+((char *)local_1b8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     "number overflow parsing \'");
      std::operator+(local_198,(char *)local_1b8);
      out_of_range::create(&local_178,0x196,local_198);
      bVar3 = (**(code **)(*puVar2 + 0x58))(puVar2,sVar9,local_158,&local_178);
      this_local._7_1_ = (bool)(bVar3 & 1);
      out_of_range::~out_of_range(&local_178);
      std::__cxx11::string::~string((string *)local_198);
      std::__cxx11::string::~string(local_1b8);
      std::__cxx11::string::~string((string *)(local_1f8 + 0x20));
      std::__cxx11::string::~string((string *)local_158);
LAB_0015fb2a:
      local_60.super__Tp_alloc_type = (_Tp_alloc_type)0x1;
      local_60._1_3_ = 0;
      std::vector<bool,_std::allocator<bool>_>::~vector
                ((vector<bool,_std::allocator<bool>_> *)local_48);
      return this_local._7_1_;
    }
    psVar6 = lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
             ::get_string(&this->m_lexer);
    bVar3 = (**(code **)(*puVar2 + 0x20))(uVar1,puVar2,psVar6);
    if (((bVar3 ^ 0xff) & 1) != 0) {
      this_local._7_1_ = false;
      goto LAB_0015fb2a;
    }
    break;
  case begin_array:
    bVar3 = (**(code **)(*states.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage + 0x48))
                      (states.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_end_of_storage,0xffffffffffffffff);
    if (((bVar3 ^ 0xff) & 1) != 0) {
      this_local._7_1_ = false;
      goto LAB_0015fb2a;
    }
    tVar5 = get_token(this);
    if (tVar5 != end_array) {
      std::vector<bool,_std::allocator<bool>_>::push_back
                ((vector<bool,_std::allocator<bool>_> *)local_48,true);
      goto LAB_0015e78b;
    }
    bVar3 = (**(code **)(*states.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage + 0x50))();
    if (((bVar3 ^ 0xff) & 1) != 0) {
      this_local._7_1_ = false;
      goto LAB_0015fb2a;
    }
    break;
  case begin_object:
    bVar3 = (**(code **)(*states.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage + 0x30))
                      (states.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_end_of_storage,0xffffffffffffffff);
    if (((bVar3 ^ 0xff) & 1) == 0) {
      tVar5 = get_token(this);
      puVar2 = states.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
               _M_end_of_storage;
      if (tVar5 == end_object) {
        bVar3 = (**(code **)(*states.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_end_of_storage + 0x40))();
        if (((bVar3 ^ 0xff) & 1) == 0) break;
        this_local._7_1_ = false;
      }
      else if (this->last_token == value_string) {
        lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
        ::get_string(&this->m_lexer);
        bVar3 = (**(code **)(*puVar2 + 0x38))();
        if (((bVar3 ^ 0xff) & 1) == 0) {
          tVar5 = get_token(this);
          puVar2 = states.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_end_of_storage;
          if (tVar5 == name_separator) goto LAB_0015ebab;
          sVar9 = lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                  ::get_position(&this->m_lexer);
          lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
          ::get_token_string((lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                              *)local_e8);
          sVar10 = lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                   ::get_position(&this->m_lexer);
          exception_message((parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                             *)&res,expected);
          parse_error::create(&local_110,0x65,sVar10,(string *)&res);
          bVar3 = (**(code **)(*puVar2 + 0x58))(puVar2,sVar9,local_e8,&local_110);
          this_local._7_1_ = (bool)(bVar3 & 1);
          parse_error::~parse_error(&local_110);
          std::__cxx11::string::~string((string *)&res);
          std::__cxx11::string::~string((string *)local_e8);
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        sVar9 = lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                ::get_position(&this->m_lexer);
        lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
        ::get_token_string((lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                            *)local_80);
        sVar10 = lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                 ::get_position(&this->m_lexer);
        exception_message((parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                           *)(local_e8 + 0x20),expected);
        parse_error::create(&local_a8,0x65,sVar10,(string *)(local_e8 + 0x20));
        bVar3 = (**(code **)(*puVar2 + 0x58))(puVar2,sVar9,local_80,&local_a8);
        this_local._7_1_ = (bool)(bVar3 & 1);
        parse_error::~parse_error(&local_a8);
        std::__cxx11::string::~string((string *)(local_e8 + 0x20));
        std::__cxx11::string::~string(local_80);
      }
    }
    else {
      this_local._7_1_ = false;
    }
    goto LAB_0015fb2a;
  default:
    sVar9 = lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
            ::get_position(&this->m_lexer);
    lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
    ::get_token_string((lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                        *)local_260);
    sVar10 = lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
             ::get_position(&this->m_lexer);
    exception_message((parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                       *)local_2a8,expected);
    parse_error::create((parse_error *)(local_2a8 + 0x20),0x65,sVar10,(string *)local_2a8);
    bVar3 = (**(code **)(*puVar2 + 0x58))(puVar2,sVar9,local_260,local_2a8 + 0x20);
    this_local._7_1_ = (bool)(bVar3 & 1);
    parse_error::~parse_error((parse_error *)(local_2a8 + 0x20));
    std::__cxx11::string::~string((string *)local_2a8);
    std::__cxx11::string::~string((string *)local_260);
    goto LAB_0015fb2a;
  case parse_error:
    sVar9 = lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
            ::get_position(&this->m_lexer);
    lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
    ::get_token_string((lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                        *)local_1f8);
    sVar10 = lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
             ::get_position(&this->m_lexer);
    exception_message((parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                       *)(local_260 + 0x20),expected);
    parse_error::create(&local_220,0x65,sVar10,(string *)(local_260 + 0x20));
    bVar3 = (**(code **)(*puVar2 + 0x58))(puVar2,sVar9,local_1f8,&local_220);
    this_local._7_1_ = (bool)(bVar3 & 1);
    parse_error::~parse_error(&local_220);
    std::__cxx11::string::~string((string *)(local_260 + 0x20));
    std::__cxx11::string::~string((string *)local_1f8);
    goto LAB_0015fb2a;
  }
LAB_0015f350:
  bVar4 = std::vector<bool,_std::allocator<bool>_>::empty
                    ((vector<bool,_std::allocator<bool>_> *)local_48);
  if (bVar4) {
    this_local._7_1_ = true;
    goto LAB_0015fb2a;
  }
  rVar11 = std::vector<bool,_std::allocator<bool>_>::back
                     ((vector<bool,_std::allocator<bool>_> *)local_48);
  local_2b8 = rVar11;
  bVar4 = std::_Bit_reference::operator_cast_to_bool(&local_2b8);
  if (bVar4) {
    tVar5 = get_token(this);
    puVar2 = states.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_end_of_storage;
    if (tVar5 == value_separator) {
      get_token(this);
    }
    else {
      if (this->last_token != end_array) {
        sVar9 = lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                ::get_position(&this->m_lexer);
        lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
        ::get_token_string((lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                            *)local_2d8);
        sVar10 = lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                 ::get_position(&this->m_lexer);
        exception_message((parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                           *)(local_340 + 0x20),expected);
        parse_error::create(&local_300,0x65,sVar10,(string *)(local_340 + 0x20));
        bVar3 = (**(code **)(*puVar2 + 0x58))(puVar2,sVar9,local_2d8,&local_300);
        this_local._7_1_ = (bool)(bVar3 & 1);
        parse_error::~parse_error(&local_300);
        std::__cxx11::string::~string((string *)(local_340 + 0x20));
        std::__cxx11::string::~string((string *)local_2d8);
        goto LAB_0015fb2a;
      }
      bVar3 = (**(code **)(*states.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_end_of_storage + 0x50))();
      if (((bVar3 ^ 0xff) & 1) != 0) {
        this_local._7_1_ = false;
        goto LAB_0015fb2a;
      }
      bVar4 = std::vector<bool,_std::allocator<bool>_>::empty
                        ((vector<bool,_std::allocator<bool>_> *)local_48);
      if (((bVar4 ^ 0xffU) & 1) == 0) {
        __assert_fail("not states.empty()",
                      "/workspace/llm4binary/github/license_c_cmakelists/yig[P]graphics101-pipeline/include/json.hpp"
                      ,0x11ef,
                      "bool nlohmann::detail::parser<nlohmann::basic_json<>>::sax_parse_internal(json_sax_t *) [BasicJsonType = nlohmann::basic_json<>]"
                     );
      }
      std::vector<bool,_std::allocator<bool>_>::pop_back
                ((vector<bool,_std::allocator<bool>_> *)local_48);
      local_60._23_1_ = 1;
    }
  }
  else {
    tVar5 = get_token(this);
    puVar2 = states.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_end_of_storage;
    if (tVar5 == value_separator) {
      tVar5 = get_token(this);
      puVar2 = states.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
               _M_end_of_storage;
      if (tVar5 != value_string) {
        sVar9 = lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                ::get_position(&this->m_lexer);
        lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
        ::get_token_string((lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                            *)local_340);
        sVar10 = lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                 ::get_position(&this->m_lexer);
        exception_message((parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                           *)(local_3a8 + 0x20),expected);
        parse_error::create(&local_368,0x65,sVar10,(string *)(local_3a8 + 0x20));
        bVar3 = (**(code **)(*puVar2 + 0x58))(puVar2,sVar9,local_340,&local_368);
        this_local._7_1_ = (bool)(bVar3 & 1);
        parse_error::~parse_error(&local_368);
        std::__cxx11::string::~string((string *)(local_3a8 + 0x20));
        std::__cxx11::string::~string((string *)local_340);
        goto LAB_0015fb2a;
      }
      lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
      ::get_string(&this->m_lexer);
      bVar3 = (**(code **)(*puVar2 + 0x38))();
      if (((bVar3 ^ 0xff) & 1) != 0) {
        this_local._7_1_ = false;
        goto LAB_0015fb2a;
      }
      tVar5 = get_token(this);
      puVar2 = states.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
               _M_end_of_storage;
      if (tVar5 != name_separator) {
        sVar9 = lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                ::get_position(&this->m_lexer);
        lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
        ::get_token_string((lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                            *)local_3a8);
        sVar10 = lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                 ::get_position(&this->m_lexer);
        exception_message((parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                           *)(local_410 + 0x20),expected);
        parse_error::create(&local_3d0,0x65,sVar10,(string *)(local_410 + 0x20));
        bVar3 = (**(code **)(*puVar2 + 0x58))(puVar2,sVar9,local_3a8,&local_3d0);
        this_local._7_1_ = (bool)(bVar3 & 1);
        parse_error::~parse_error(&local_3d0);
        std::__cxx11::string::~string((string *)(local_410 + 0x20));
        std::__cxx11::string::~string((string *)local_3a8);
        goto LAB_0015fb2a;
      }
      get_token(this);
    }
    else {
      if (this->last_token != end_object) {
        sVar9 = lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                ::get_position(&this->m_lexer);
        lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
        ::get_token_string((lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                            *)local_410);
        sVar10 = lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                 ::get_position(&this->m_lexer);
        exception_message((parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                           *)local_458,expected);
        parse_error::create((parse_error *)(local_458 + 0x20),0x65,sVar10,(string *)local_458);
        bVar3 = (**(code **)(*puVar2 + 0x58))(puVar2,sVar9,local_410,local_458 + 0x20);
        this_local._7_1_ = (bool)(bVar3 & 1);
        parse_error::~parse_error((parse_error *)(local_458 + 0x20));
        std::__cxx11::string::~string((string *)local_458);
        std::__cxx11::string::~string((string *)local_410);
        goto LAB_0015fb2a;
      }
      bVar3 = (**(code **)(*states.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_end_of_storage + 0x40))();
      if (((bVar3 ^ 0xff) & 1) != 0) {
        this_local._7_1_ = false;
        goto LAB_0015fb2a;
      }
      bVar4 = std::vector<bool,_std::allocator<bool>_>::empty
                        ((vector<bool,_std::allocator<bool>_> *)local_48);
      if (((bVar4 ^ 0xffU) & 1) == 0) {
        __assert_fail("not states.empty()",
                      "/workspace/llm4binary/github/license_c_cmakelists/yig[P]graphics101-pipeline/include/json.hpp"
                      ,0x1228,
                      "bool nlohmann::detail::parser<nlohmann::basic_json<>>::sax_parse_internal(json_sax_t *) [BasicJsonType = nlohmann::basic_json<>]"
                     );
      }
      std::vector<bool,_std::allocator<bool>_>::pop_back
                ((vector<bool,_std::allocator<bool>_> *)local_48);
      local_60._23_1_ = 1;
    }
  }
  goto LAB_0015e78b;
LAB_0015ebab:
  std::vector<bool,_std::allocator<bool>_>::push_back
            ((vector<bool,_std::allocator<bool>_> *)local_48,false);
  get_token(this);
  goto LAB_0015e78b;
}

Assistant:

bool sax_parse_internal(json_sax_t* sax)
    {
        // stack to remember the hieararchy of structured values we are parsing
        // true = array; false = object
        std::vector<bool> states;
        // value to avoid a goto (see comment where set to true)
        bool skip_to_state_evaluation = false;

        while (true)
        {
            if (not skip_to_state_evaluation)
            {
                // invariant: get_token() was called before each iteration
                switch (last_token)
                {
                    case token_type::begin_object:
                    {
                        if (JSON_UNLIKELY(not sax->start_object()))
                        {
                            return false;
                        }

                        // closing } -> we are done
                        if (get_token() == token_type::end_object)
                        {
                            if (JSON_UNLIKELY(not sax->end_object()))
                            {
                                return false;
                            }
                            break;
                        }

                        // parse key
                        if (JSON_UNLIKELY(last_token != token_type::value_string))
                        {
                            return sax->parse_error(m_lexer.get_position(),
                                                    m_lexer.get_token_string(),
                                                    parse_error::create(101, m_lexer.get_position(), exception_message(token_type::value_string)));
                        }
                        else
                        {
                            if (JSON_UNLIKELY(not sax->key(m_lexer.get_string())))
                            {
                                return false;
                            }
                        }

                        // parse separator (:)
                        if (JSON_UNLIKELY(get_token() != token_type::name_separator))
                        {
                            return sax->parse_error(m_lexer.get_position(),
                                                    m_lexer.get_token_string(),
                                                    parse_error::create(101, m_lexer.get_position(), exception_message(token_type::name_separator)));
                        }

                        // remember we are now inside an object
                        states.push_back(false);

                        // parse values
                        get_token();
                        continue;
                    }

                    case token_type::begin_array:
                    {
                        if (JSON_UNLIKELY(not sax->start_array()))
                        {
                            return false;
                        }

                        // closing ] -> we are done
                        if (get_token() == token_type::end_array)
                        {
                            if (JSON_UNLIKELY(not sax->end_array()))
                            {
                                return false;
                            }
                            break;
                        }

                        // remember we are now inside an array
                        states.push_back(true);

                        // parse values (no need to call get_token)
                        continue;
                    }

                    case token_type::value_float:
                    {
                        const auto res = m_lexer.get_number_float();

                        if (JSON_UNLIKELY(not std::isfinite(res)))
                        {
                            return sax->parse_error(m_lexer.get_position(),
                                                    m_lexer.get_token_string(),
                                                    out_of_range::create(406, "number overflow parsing '" + m_lexer.get_token_string() + "'"));
                        }
                        else
                        {
                            if (JSON_UNLIKELY(not sax->number_float(res, m_lexer.get_string())))
                            {
                                return false;
                            }
                            break;
                        }
                    }

                    case token_type::literal_false:
                    {
                        if (JSON_UNLIKELY(not sax->boolean(false)))
                        {
                            return false;
                        }
                        break;
                    }

                    case token_type::literal_null:
                    {
                        if (JSON_UNLIKELY(not sax->null()))
                        {
                            return false;
                        }
                        break;
                    }

                    case token_type::literal_true:
                    {
                        if (JSON_UNLIKELY(not sax->boolean(true)))
                        {
                            return false;
                        }
                        break;
                    }

                    case token_type::value_integer:
                    {
                        if (JSON_UNLIKELY(not sax->number_integer(m_lexer.get_number_integer())))
                        {
                            return false;
                        }
                        break;
                    }

                    case token_type::value_string:
                    {
                        if (JSON_UNLIKELY(not sax->string(m_lexer.get_string())))
                        {
                            return false;
                        }
                        break;
                    }

                    case token_type::value_unsigned:
                    {
                        if (JSON_UNLIKELY(not sax->number_unsigned(m_lexer.get_number_unsigned())))
                        {
                            return false;
                        }
                        break;
                    }

                    case token_type::parse_error:
                    {
                        // using "uninitialized" to avoid "expected" message
                        return sax->parse_error(m_lexer.get_position(),
                                                m_lexer.get_token_string(),
                                                parse_error::create(101, m_lexer.get_position(), exception_message(token_type::uninitialized)));
                    }

                    default: // the last token was unexpected
                    {
                        return sax->parse_error(m_lexer.get_position(),
                                                m_lexer.get_token_string(),
                                                parse_error::create(101, m_lexer.get_position(), exception_message(token_type::literal_or_value)));
                    }
                }
            }
            else
            {
                skip_to_state_evaluation = false;
            }

            // we reached this line after we successfully parsed a value
            if (states.empty())
            {
                // empty stack: we reached the end of the hieararchy: done
                return true;
            }
            else
            {
                if (states.back())  // array
                {
                    // comma -> next value
                    if (get_token() == token_type::value_separator)
                    {
                        // parse a new value
                        get_token();
                        continue;
                    }

                    // closing ]
                    if (JSON_LIKELY(last_token == token_type::end_array))
                    {
                        if (JSON_UNLIKELY(not sax->end_array()))
                        {
                            return false;
                        }

                        // We are done with this array. Before we can parse a
                        // new value, we need to evaluate the new state first.
                        // By setting skip_to_state_evaluation to false, we
                        // are effectively jumping to the beginning of this if.
                        assert(not states.empty());
                        states.pop_back();
                        skip_to_state_evaluation = true;
                        continue;
                    }
                    else
                    {
                        return sax->parse_error(m_lexer.get_position(),
                                                m_lexer.get_token_string(),
                                                parse_error::create(101, m_lexer.get_position(), exception_message(token_type::end_array)));
                    }
                }
                else  // object
                {
                    // comma -> next value
                    if (get_token() == token_type::value_separator)
                    {
                        // parse key
                        if (JSON_UNLIKELY(get_token() != token_type::value_string))
                        {
                            return sax->parse_error(m_lexer.get_position(),
                                                    m_lexer.get_token_string(),
                                                    parse_error::create(101, m_lexer.get_position(), exception_message(token_type::value_string)));
                        }
                        else
                        {
                            if (JSON_UNLIKELY(not sax->key(m_lexer.get_string())))
                            {
                                return false;
                            }
                        }

                        // parse separator (:)
                        if (JSON_UNLIKELY(get_token() != token_type::name_separator))
                        {
                            return sax->parse_error(m_lexer.get_position(),
                                                    m_lexer.get_token_string(),
                                                    parse_error::create(101, m_lexer.get_position(), exception_message(token_type::name_separator)));
                        }

                        // parse values
                        get_token();
                        continue;
                    }

                    // closing }
                    if (JSON_LIKELY(last_token == token_type::end_object))
                    {
                        if (JSON_UNLIKELY(not sax->end_object()))
                        {
                            return false;
                        }

                        // We are done with this object. Before we can parse a
                        // new value, we need to evaluate the new state first.
                        // By setting skip_to_state_evaluation to false, we
                        // are effectively jumping to the beginning of this if.
                        assert(not states.empty());
                        states.pop_back();
                        skip_to_state_evaluation = true;
                        continue;
                    }
                    else
                    {
                        return sax->parse_error(m_lexer.get_position(),
                                                m_lexer.get_token_string(),
                                                parse_error::create(101, m_lexer.get_position(), exception_message(token_type::end_object)));
                    }
                }
            }
        }
    }